

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::counterBufferType(HlslParseContext *this,TSourceLoc *loc,TType *type)

{
  char *__s;
  int iVar1;
  TType *this_00;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_01;
  undefined4 extraout_var;
  TQualifier *pTVar2;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *s;
  pool_allocator<char> local_148;
  TString local_140;
  undefined1 local_118 [8];
  TType blockType;
  TTypeLoc member;
  TTypeList *blockStruct;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_50;
  TType *local_28;
  TType *counterType;
  TType *type_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  counterType = type;
  type_local = (TType *)loc;
  loc_local = (TSourceLoc *)this;
  this_00 = (TType *)TType::operator_new((TType *)0x98,(size_t)loc);
  TType::TType(this_00,EbtUint,EvqBuffer,1,0,0,false);
  __s = ((this->super_TParseContextBase).super_TParseVersions.intermediate)->implicitCounterName;
  local_28 = this_00;
  pool_allocator<char>::pool_allocator((pool_allocator<char> *)&blockStruct);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_50,
             __s,(pool_allocator<char> *)&blockStruct);
  s = &local_50;
  (*this_00->_vptr_TType[4])();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_50);
  this_01 = (vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
            TVector<glslang::TTypeLoc>::operator_new((TVector<glslang::TTypeLoc> *)0x20,(size_t)s);
  TVector<glslang::TTypeLoc>::TVector((TVector<glslang::TTypeLoc> *)this_01);
  blockType.spirvType = (TSpirvType *)local_28;
  std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::push_back
            (this_01,(value_type *)&blockType.spirvType);
  pool_allocator<char>::pool_allocator(&local_148);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_140,
             "",&local_148);
  iVar1 = (*local_28->_vptr_TType[10])();
  TType::TType((TType *)local_118,(TTypeList *)this_01,&local_140,
               (TQualifier *)CONCAT44(extraout_var,iVar1));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_140);
  pTVar2 = TType::getQualifier((TType *)local_118);
  *(ulong *)&pTVar2->field_0x8 = *(ulong *)&pTVar2->field_0x8 & 0xffffffffffffff80 | 6;
  TType::shallowCopy(counterType,(TType *)local_118);
  shareStructBufferType(this,counterType);
  TType::~TType((TType *)local_118);
  return;
}

Assistant:

void HlslParseContext::counterBufferType(const TSourceLoc& loc, TType& type)
{
    // Counter type
    TType* counterType = new TType(EbtUint, EvqBuffer);
    counterType->setFieldName(intermediate.implicitCounterName);

    TTypeList* blockStruct = new TTypeList;
    TTypeLoc  member = { counterType, loc };
    blockStruct->push_back(member);

    TType blockType(blockStruct, "", counterType->getQualifier());
    blockType.getQualifier().storage = EvqBuffer;

    type.shallowCopy(blockType);
    shareStructBufferType(type);
}